

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode format_convert(SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  SUNErrCode SVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 uVar20;
  long lVar21;
  
  pvVar3 = A->content;
  iVar2 = *(int *)((long)pvVar3 + 0x28);
  pvVar4 = B->content;
  if (iVar2 != *(int *)((long)pvVar4 + 0x28)) {
    lVar5 = *(long *)((long)pvVar3 + 0x38);
    lVar6 = *(long *)((long)pvVar3 + 0x20);
    lVar7 = *(long *)((long)pvVar3 + 0x30);
    uVar8 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 != 1) * 8);
    uVar9 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 == 1) * 8);
    lVar10 = *(long *)((long)pvVar4 + 0x38);
    lVar11 = *(long *)((long)pvVar4 + 0x20);
    lVar12 = *(long *)((long)pvVar4 + 0x30);
    uVar19 = *(ulong *)(lVar5 + uVar8 * 8);
    uVar17 = SUNMatZero_Sparse(B);
    uVar18 = (ulong)uVar17;
    if (0 < (long)uVar19) {
      uVar18 = 0;
      do {
        plVar1 = (long *)(lVar10 + *(long *)(lVar7 + uVar18 * 8) * 8);
        *plVar1 = *plVar1 + 1;
        uVar18 = uVar18 + 1;
      } while (uVar19 != uVar18);
    }
    if (0 < (long)uVar9) {
      uVar18 = 0;
      lVar21 = 0;
      do {
        lVar13 = *(long *)(lVar10 + uVar18 * 8);
        *(long *)(lVar10 + uVar18 * 8) = lVar21;
        uVar18 = uVar18 + 1;
        lVar21 = lVar13 + lVar21;
      } while (uVar9 != uVar18);
    }
    *(ulong *)(lVar10 + uVar9 * 8) = uVar19;
    if (0 < (long)uVar8) {
      uVar19 = 0;
      do {
        lVar21 = *(long *)(lVar5 + uVar19 * 8);
        uVar18 = uVar19 + 1;
        if (lVar21 < *(long *)(lVar5 + 8 + uVar19 * 8)) {
          do {
            lVar13 = *(long *)(lVar7 + lVar21 * 8);
            lVar14 = *(long *)(lVar10 + lVar13 * 8);
            *(ulong *)(lVar12 + lVar14 * 8) = uVar19;
            *(undefined8 *)(lVar11 + lVar14 * 8) = *(undefined8 *)(lVar6 + lVar21 * 8);
            plVar1 = (long *)(lVar10 + lVar13 * 8);
            *plVar1 = *plVar1 + 1;
            lVar21 = lVar21 + 1;
          } while (lVar21 < *(long *)(lVar5 + uVar18 * 8));
        }
        uVar19 = uVar18;
      } while (uVar18 != uVar8);
    }
    if (-1 < (long)uVar9) {
      uVar18 = 0;
      uVar20 = 0;
      do {
        uVar15 = *(undefined8 *)(lVar10 + uVar18 * 8);
        *(undefined8 *)(lVar10 + uVar18 * 8) = uVar20;
        uVar18 = uVar18 + 1;
        uVar20 = uVar15;
      } while (uVar9 + 1 != uVar18);
    }
    return (SUNErrCode)uVar18;
  }
  SVar16 = SUNMatCopy_Sparse(A,B);
  return SVar16;
}

Assistant:

SUNErrCode format_convert(const SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);

  sunrealtype *Ax, *Bx;
  sunindextype *Ap, *Aj;
  sunindextype *Bp, *Bi;
  sunindextype n_row, n_col, nnz;
  sunindextype n, col, csum, row, last;

  if (SM_SPARSETYPE_S(A) == SM_SPARSETYPE_S(B))
  {
    SUNCheckCall(SUNMatCopy_Sparse(A, B));
    return SUN_SUCCESS;
  }

  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Aj = SM_INDEXVALS_S(A);
  SUNAssert(Aj, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  n_row = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_ROWS_S(A) : SM_COLUMNS_S(A);
  n_col = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_COLUMNS_S(A) : SM_ROWS_S(A);

  Bp = SM_INDEXPTRS_S(B);
  Bi = SM_INDEXVALS_S(B);
  Bx = SM_DATA_S(B);

  nnz = Ap[n_row];

  SUNCheckCall(SUNMatZero_Sparse(B));

  /* compute number of non-zero entries per column (if CSR) or per row (if CSC)
   * of A */
  for (n = 0; n < nnz; n++) { Bp[Aj[n]]++; }

  /* cumualtive sum the nnz per column to get Bp[] */
  for (col = 0, csum = 0; col < n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = csum;
    csum += temp;
  }
  Bp[n_col] = nnz;

  for (row = 0; row < n_row; row++)
  {
    sunindextype jj;
    for (jj = Ap[row]; jj < Ap[row + 1]; jj++)
    {
      col               = Aj[jj];
      sunindextype dest = Bp[col];

      Bi[dest] = row;
      Bx[dest] = Ax[jj];

      Bp[col]++;
    }
  }

  for (col = 0, last = 0; col <= n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = last;
    last              = temp;
  }

  return SUN_SUCCESS;
}